

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interpreter.cpp
# Opt level: O0

bool __thiscall
Interpreter::belongToCondition
          (Interpreter *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *condition_string_vector_arg,Command *condition_command_pointer_arg)

{
  Command *local_28;
  Command *condition_command_pointer_arg_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *condition_string_vector_arg_local;
  Interpreter *this_local;
  
  local_28 = condition_command_pointer_arg;
  condition_command_pointer_arg_local = (Command *)condition_string_vector_arg;
  condition_string_vector_arg_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)this;
  if ((this->is_if_command & 1U) == 0) {
    if ((this->is_while_command & 1U) == 0) {
      this_local._7_1_ = false;
    }
    else {
      std::vector<Command_*,_std::allocator<Command_*>_>::push_back
                (&this->while_commands_pointers,&local_28);
      std::
      vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::push_back(&this->while_strings_vectors,condition_string_vector_arg);
      this_local._7_1_ = true;
    }
  }
  else {
    std::vector<Command_*,_std::allocator<Command_*>_>::push_back
              (&this->if_commands_pointers,&local_28);
    std::
    vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::push_back(&this->if_strings_vectors,condition_string_vector_arg);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool Interpreter::belongToCondition(vector<string> condition_string_vector_arg,
                                    Command *condition_command_pointer_arg) {
  if (this->is_if_command) {
    this->if_commands_pointers.push_back(condition_command_pointer_arg);
    this->if_strings_vectors.push_back(condition_string_vector_arg);
    return true;
  } else if (this->is_while_command) {
    this->while_commands_pointers.push_back(condition_command_pointer_arg);
    this->while_strings_vectors.push_back(condition_string_vector_arg);
    return true;
  } else return false;
}